

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

ParseStatus
duckdb_re2::ParseUnicodeGroup
          (StringPiece *s,ParseFlags parse_flags,CharClassBuilder *cc,RegexpStatus *status)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  StringPiece *name;
  const_pointer pcVar5;
  undefined1 *g;
  ParseStatus PVar6;
  duckdb_re2 *this;
  uint sign;
  Rune c;
  int local_5c;
  StringPiece local_58;
  StringPiece local_48;
  duckdb_re2 *local_38;
  
  if ((parse_flags >> 10 & 1) == 0) {
    return kParseNothing;
  }
  if (s->size_ < 2) {
    return kParseNothing;
  }
  pcVar2 = s->data_;
  if (*pcVar2 != '\\') {
    return kParseNothing;
  }
  bVar1 = pcVar2[1];
  local_5c = (int)(char)bVar1;
  if ((bVar1 & 0xdf) != 0x50) {
    return kParseNothing;
  }
  local_58.data_ = s->data_;
  local_58.size_ = s->size_;
  local_48.data_ = (const_pointer)0x0;
  local_48.size_ = 0;
  s->data_ = pcVar2 + 2;
  s->size_ = s->size_ - 2;
  iVar4 = StringPieceToRune(&local_5c,s,status);
  PVar6 = kParseError;
  if (iVar4 == 0) {
    return kParseError;
  }
  if (local_5c == 0x7b) {
    name = (StringPiece *)StringPiece::find(s,'}',0);
    if (name != (StringPiece *)0xffffffffffffffff) {
      local_48.data_ = s->data_;
      s->data_ = (const_pointer)((duckdb_re2 *)local_48.data_ + (long)name + 1);
      s->size_ = s->size_ - (long)((long)&name->data_ + 1);
      local_48.size_ = (size_type)name;
      local_38 = (duckdb_re2 *)local_48.data_;
      bVar3 = IsValidUTF8(&local_48,status);
      if (!bVar3) {
        return kParseError;
      }
      pcVar5 = s->data_;
      this = local_38;
      goto LAB_0048e1a6;
    }
    bVar3 = IsValidUTF8(&local_58,status);
    if (!bVar3) {
      return kParseError;
    }
LAB_0048e25c:
    status->code_ = kRegexpBadCharRange;
    (status->error_arg_).data_ = local_58.data_;
    (status->error_arg_).size_ = local_58.size_;
  }
  else {
    this = (duckdb_re2 *)(local_58.data_ + 2);
    pcVar5 = s->data_;
    name = (StringPiece *)(pcVar5 + -(long)this);
    local_48.data_ = (const_pointer)this;
    local_48.size_ = (size_type)name;
LAB_0048e1a6:
    local_58.size_ = (long)pcVar5 - (long)local_58.data_;
    sign = (uint)(bVar1 != 0x50) * 2 - 1;
    if (name == (StringPiece *)0x0) {
      name = (StringPiece *)0x0;
LAB_0048e219:
      g = (undefined1 *)LookupGroup(this,name,(UGroup *)unicode_groups,199);
      if ((UGroup *)g == (UGroup *)0x0) goto LAB_0048e25c;
    }
    else {
      if (*this == (duckdb_re2)0x5e) {
        sign = -(uint)(bVar1 != 0x50) | 1;
        this = this + 1;
        name = (StringPiece *)((long)&name[-1].size_ + 7);
        local_48.data_ = (const_pointer)this;
        local_48.size_ = (size_type)name;
      }
      if ((name != (StringPiece *)&DAT_00000003) ||
         ((g = anygroup, this != (duckdb_re2 *)"Any" &&
          (name = (StringPiece *)&DAT_00000003,
          this[2] != (duckdb_re2)0x79 || *(short *)this != 0x6e41)))) goto LAB_0048e219;
    }
    AddUGroup(cc,(UGroup *)g,sign,parse_flags);
    PVar6 = kParseOk;
  }
  return PVar6;
}

Assistant:

ParseStatus ParseUnicodeGroup(StringPiece* s, Regexp::ParseFlags parse_flags,
                              CharClassBuilder *cc,
                              RegexpStatus* status) {
  // Decide whether to parse.
  if (!(parse_flags & Regexp::UnicodeGroups))
    return kParseNothing;
  if (s->size() < 2 || (*s)[0] != '\\')
    return kParseNothing;
  Rune c = (*s)[1];
  if (c != 'p' && c != 'P')
    return kParseNothing;

  // Committed to parse.  Results:
  int sign = +1;  // -1 = negated char class
  if (c == 'P')
    sign = -sign;
  StringPiece seq = *s;  // \p{Han} or \pL
  StringPiece name;  // Han or L
  s->remove_prefix(2);  // '\\', 'p'

  if (!StringPieceToRune(&c, s, status))
    return kParseError;
  if (c != '{') {
    // Name is the bit of string we just skipped over for c.
    const char* p = seq.data() + 2;
    name = StringPiece(p, static_cast<size_t>(s->data() - p));
  } else {
    // Name is in braces. Look for closing }
    size_t end = s->find('}', 0);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(seq, status))
        return kParseError;
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(seq);
      return kParseError;
    }
    name = StringPiece(s->data(), end);  // without '}'
    s->remove_prefix(end + 1);  // with '}'
    if (!IsValidUTF8(name, status))
      return kParseError;
  }

  // Chop seq where s now begins.
  seq = StringPiece(seq.data(), static_cast<size_t>(s->data() - seq.data()));

  if (!name.empty() && name[0] == '^') {
    sign = -sign;
    name.remove_prefix(1);  // '^'
  }

#if !defined(RE2_USE_ICU)
  // Look up the group in the RE2 Unicode data.
  const UGroup *g = LookupUnicodeGroup(name);
  if (g == NULL) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  AddUGroup(cc, g, sign, parse_flags);
#else
  // Look up the group in the ICU Unicode data. Because ICU provides full
  // Unicode properties support, this could be more than a lookup by name.
  ::icu::UnicodeString ustr = ::icu::UnicodeString::fromUTF8(
      std::string("\\p{") + std::string(name) + std::string("}"));
  UErrorCode uerr = U_ZERO_ERROR;
  ::icu::UnicodeSet uset(ustr, uerr);
  if (U_FAILURE(uerr)) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  // Convert the UnicodeSet to a URange32 and UGroup that we can add.
  int nr = uset.getRangeCount();
  PODArray<URange32> r(nr);
  for (int i = 0; i < nr; i++) {
    r[i].lo = uset.getRangeStart(i);
    r[i].hi = uset.getRangeEnd(i);
  }
  UGroup g = {"", +1, 0, 0, r.data(), nr};
  AddUGroup(cc, &g, sign, parse_flags);
#endif

  return kParseOk;
}